

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::Initialize(cmCTestBuildHandler *this)

{
  iterator iVar1;
  cmCTestBuildHandler *this_local;
  
  cmCTestGenericHandler::Initialize(&this->super_cmCTestGenericHandler);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomErrorMatches);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomErrorExceptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomWarningMatches);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CustomWarningExceptions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->ReallyCustomWarningMatches);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->ReallyCustomWarningExceptions);
  std::
  vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
  ::clear(&this->ErrorWarningFileLineRegex);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->ErrorMatchRegex);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->ErrorExceptionRegex);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->WarningMatchRegex);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->WarningExceptionRegex);
  std::deque<char,_std::allocator<char>_>::clear(&this->BuildProcessingQueue);
  std::deque<char,_std::allocator<char>_>::clear(&this->BuildProcessingErrorQueue);
  this->BuildOutputLogSize = 0;
  std::vector<char,_std::allocator<char>_>::clear(&this->CurrentProcessingLine);
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  this->OutputLineCounter = 0;
  std::
  vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
  ::clear(&this->ErrorsAndWarnings);
  iVar1 = std::
          vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
          ::end(&this->ErrorsAndWarnings);
  (this->LastErrorOrWarning)._M_current = iVar1._M_current;
  this->PostContextCount = 0;
  this->MaxPreContext = 10;
  this->MaxPostContext = 10;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->PreContext);
  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->LastTickChar = '\0';
  this->ErrorQuotaReached = false;
  this->WarningQuotaReached = false;
  this->MaxErrors = 0x32;
  this->MaxWarnings = 0x32;
  this->UseCTestLaunch = false;
  return;
}

Assistant:

void cmCTestBuildHandler::Initialize()
{
  this->Superclass::Initialize();
  this->StartBuild.clear();
  this->EndBuild.clear();
  this->CustomErrorMatches.clear();
  this->CustomErrorExceptions.clear();
  this->CustomWarningMatches.clear();
  this->CustomWarningExceptions.clear();
  this->ReallyCustomWarningMatches.clear();
  this->ReallyCustomWarningExceptions.clear();
  this->ErrorWarningFileLineRegex.clear();

  this->ErrorMatchRegex.clear();
  this->ErrorExceptionRegex.clear();
  this->WarningMatchRegex.clear();
  this->WarningExceptionRegex.clear();
  this->BuildProcessingQueue.clear();
  this->BuildProcessingErrorQueue.clear();
  this->BuildOutputLogSize = 0;
  this->CurrentProcessingLine.clear();

  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  this->OutputLineCounter = 0;
  this->ErrorsAndWarnings.clear();
  this->LastErrorOrWarning = this->ErrorsAndWarnings.end();
  this->PostContextCount = 0;
  this->MaxPreContext = 10;
  this->MaxPostContext = 10;
  this->PreContext.clear();

  this->TotalErrors = 0;
  this->TotalWarnings = 0;
  this->LastTickChar = 0;

  this->ErrorQuotaReached = false;
  this->WarningQuotaReached = false;

  this->MaxErrors = 50;
  this->MaxWarnings = 50;

  this->UseCTestLaunch = false;
}